

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O3

uint32 rw::xbox::getSizeNativeTexture(Texture *tex)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  uVar2 = Raster::getNumLevels(tex->raster);
  if ((int)uVar2 < 1) {
    uVar2 = 0x68;
  }
  else {
    iVar4 = 0x68;
    lVar5 = 0;
    do {
      iVar4 = iVar4 + *(int *)(*(long *)((long)&tex->raster->platform + (long)nativeRasterOffset) +
                               0x10 + lVar5);
      lVar5 = lVar5 + 0x18;
    } while ((ulong)uVar2 * 0x18 != lVar5);
    uVar2 = iVar4 + 3U & 0xfffffffc;
  }
  uVar1 = tex->raster->format;
  uVar3 = 0x80;
  if ((uVar1 >> 0xe & 1) == 0) {
    uVar3 = uVar1 >> 3 & 0x400;
  }
  return uVar3 + uVar2;
}

Assistant:

uint32
getSizeNativeTexture(Texture *tex)
{
	uint32 size = 12 + 72 + 16 + 4;
	int32 levels = tex->raster->getNumLevels();
	for(int32 i = 0; i < levels; i++)
		size += getLevelSize(tex->raster, i);
	size = (size+3)&~3;
	if(tex->raster->format & Raster::PAL4)
		size += 4*32;
	else if(tex->raster->format & Raster::PAL8)
		size += 4*256;
	return size;
}